

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.hpp
# Opt level: O2

void __thiscall
yactfr::internal::PktProcBuilder::
_buildReadVarInstr<yactfr::internal::BeginReadVarSIntSelInstr,yactfr::VariantWithSignedIntegerSelectorType>
          (PktProcBuilder *this,StructureMemberType *memberType,
          VariantWithSignedIntegerSelectorType *varType,Proc *baseProc,Kind endInstrKind)

{
  pointer puVar1;
  Proc *baseProc_00;
  uint uVar2;
  ulong uVar3;
  shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr> instr;
  shared_ptr<yactfr::internal::EndReadDataInstr> endInstr;
  Kind local_8c;
  StructureMemberType *local_88;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> _Stack_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  shared_ptr<yactfr::internal::Instr> local_68;
  Proc *local_50;
  undefined1 local_48 [8];
  shared_ptr<yactfr::internal::Instr> local_40;
  
  local_8c = endInstrKind;
  local_50 = baseProc;
  local_48 = (undefined1  [8])memberType;
  std::
  make_shared<yactfr::internal::BeginReadVarSIntSelInstr,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
            (&local_88,(VariantWithSignedIntegerSelectorType *)local_48);
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    puVar1 = (varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
             super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
                      super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar3)
    break;
    baseProc_00 = (Proc *)((local_88->_name)._M_dataplus._M_p + uVar3 * 0x38 + 8);
    _buildReadInstr(this,(StructureMemberType *)0x0,
                    *(DataType **)
                     ((long)puVar1[uVar3]._M_t.
                            super___uniq_ptr_impl<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>
                            ._M_t + 0x50),baseProc_00);
    std::
    make_shared<yactfr::internal::EndReadDataInstr,yactfr::internal::Instr::Kind_const&,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
              ((Kind *)&local_78,(StructureMemberType **)&local_8c,
               (VariantWithSignedIntegerSelectorType *)local_48);
    local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_78;
    local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_70._M_pi;
    local_78 = (element_type *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Proc::pushBack(baseProc_00,&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
    uVar2 = uVar2 + 1;
  }
  local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_88;
  local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_80._M_head_impl;
  local_88 = (StructureMemberType *)0x0;
  _Stack_80._M_head_impl = (MapItem *)0x0;
  Proc::pushBack(local_50,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_80);
  return;
}

Assistant:

void PktProcBuilder::_buildReadVarInstr(const StructureMemberType * const memberType,
                                        const VarTypeT& varType, Proc& baseProc,
                                        const Instr::Kind endInstrKind)
{
    auto instr = std::make_shared<BeginReadVarInstrT>(memberType, varType);

    for (auto i = 0U; i < varType.size(); ++i) {
        auto& optProc = instr->opts()[i].proc();

        this->_buildReadInstr(nullptr, varType[i].dataType(), optProc);

        /*
         * The VM can push the procedure of each option as the current
         * one, so each one ends with an "end read variant" instruction
         * to be consistent with other begin/end instruction pairs.
         */
        auto endInstr = std::make_shared<EndReadDataInstr>(endInstrKind, memberType, varType);

        optProc.pushBack(std::move(endInstr));
    }

    baseProc.pushBack(std::move(instr));
}